

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

void __thiscall expr_tree::simplify(expr_tree *this,expr_node *node)

{
  bool bVar1;
  expr_tree *this_00;
  
  if (node->type == '\x05') {
    if (node->left != (expr_node *)0x0) {
      simplify(this,node->left);
    }
    if (node->right != (expr_node *)0x0) {
      simplify(this,node->right);
    }
    this_00 = (expr_tree *)node;
    bVar1 = IsCalculable(node);
    if (bVar1) {
      calcSimplifs(this_00,node);
      return;
    }
    switch((node->value).integer) {
    case 1:
      addSimplifs(this_00,node);
      return;
    case 2:
      subSimplifs(this_00,node);
      return;
    case 3:
      mulSimplifs(this_00,node);
      return;
    case 4:
      divSimplifs(this_00,node);
      return;
    case 5:
      pwrSimplifs(this_00,node);
      return;
    }
  }
  return;
}

Assistant:

void expr_tree::simplify(expr_node* node)
{
    if (node->type != OP)
        return;
    if (node->left)
        simplify(node->left);
    if (node->right)
        simplify(node->right);
    if (IsCalculable(node)) {
        calcSimplifs(node);
        return;
    }
    switch (node->value.integer) {
    case ADD:
        addSimplifs(node);
        break;
    case SUB:
        subSimplifs(node);
        break;
    case MUL:
        mulSimplifs(node);
        break;
    case DIV:
        divSimplifs(node);
        break;
    case PWR:
        pwrSimplifs(node);
        break;
    default:
        break;
    }
}